

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O0

void duckdb::VarPopOperation::Finalize<double,duckdb::StddevState>
               (StddevState *state,double *target,AggregateFinalizeData *finalize_data)

{
  ulong uVar1;
  OutOfRangeException *this;
  double *in_RSI;
  ulong *in_RDI;
  undefined1 auVar2 [16];
  double local_58;
  allocator local_39;
  string local_38 [24];
  AggregateFinalizeData *in_stack_ffffffffffffffe0;
  
  if (*in_RDI == 0) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffe0);
  }
  else {
    if (*in_RDI < 2) {
      local_58 = 0.0;
    }
    else {
      uVar1 = *in_RDI;
      auVar2._8_4_ = (int)(uVar1 >> 0x20);
      auVar2._0_8_ = uVar1;
      auVar2._12_4_ = 0x45300000;
      local_58 = (double)in_RDI[2] /
                 ((auVar2._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    }
    *in_RSI = local_58;
    uVar1 = duckdb::Value::DoubleIsFinite(*in_RSI);
    if ((uVar1 & 1) == 0) {
      this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"VARPOP is out of range!",&local_39);
      duckdb::OutOfRangeException::OutOfRangeException(this,local_38);
      __cxa_throw(this,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
    }
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			target = state.count > 1 ? (state.dsquared / state.count) : 0;
			if (!Value::DoubleIsFinite(target)) {
				throw OutOfRangeException("VARPOP is out of range!");
			}
		}
	}